

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::
     class_<ki::protocol::net::ClientDMLSession,_ki::protocol::net::ClientSession,_ki::protocol::net::DMLSession,_PyClientDMLSession>
     ::init_holder(instance *inst,value_and_holder *v_h,holder_type *holder_ptr,void *param_4)

{
  unique_ptr<ki::protocol::net::ClientDMLSession,std::default_delete<ki::protocol::net::ClientDMLSession>>
  *this;
  ClientDMLSession **ppCVar1;
  void *param_3_local;
  holder_type *holder_ptr_local;
  value_and_holder *v_h_local;
  instance *inst_local;
  
  if (holder_ptr == (holder_type *)0x0) {
    if ((inst->field_0x30 & 1) != 0) {
      this = (unique_ptr<ki::protocol::net::ClientDMLSession,std::default_delete<ki::protocol::net::ClientDMLSession>>
              *)detail::value_and_holder::
                holder<std::unique_ptr<ki::protocol::net::ClientDMLSession,std::default_delete<ki::protocol::net::ClientDMLSession>>>
                          (v_h);
      ppCVar1 = detail::value_and_holder::value_ptr<ki::protocol::net::ClientDMLSession>(v_h);
      std::
      unique_ptr<ki::protocol::net::ClientDMLSession,std::default_delete<ki::protocol::net::ClientDMLSession>>
      ::unique_ptr<std::default_delete<ki::protocol::net::ClientDMLSession>,void>(this,*ppCVar1);
      detail::value_and_holder::set_holder_constructed(v_h,true);
    }
  }
  else {
    init_holder_from_existing(v_h,holder_ptr);
    detail::value_and_holder::set_holder_constructed(v_h,true);
  }
  return;
}

Assistant:

static void init_holder(detail::instance *inst, detail::value_and_holder &v_h,
            const holder_type *holder_ptr, const void * /* dummy -- not enable_shared_from_this<T>) */) {
        if (holder_ptr) {
            init_holder_from_existing(v_h, holder_ptr, std::is_copy_constructible<holder_type>());
            v_h.set_holder_constructed();
        } else if (inst->owned || detail::always_construct_holder<holder_type>::value) {
            new (std::addressof(v_h.holder<holder_type>())) holder_type(v_h.value_ptr<type>());
            v_h.set_holder_constructed();
        }
    }